

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcondensedcompel.cpp
# Opt level: O0

void __thiscall TPZCondensedCompEl::Assemble(TPZCondensedCompEl *this)

{
  long *plVar1;
  TPZMatrix<double> *pTVar2;
  int64_t iVar3;
  double *pdVar4;
  TPZElementMatrixT<double> *in_RDI;
  int64_t j;
  int64_t i;
  int64_t dim;
  TPZElementMatrixT<double> ef;
  TPZElementMatrixT<double> ek;
  TPZMatRed<double,_TPZFMatrix<double>_> *in_stack_ffffffffffff7908;
  _func_int **pp_Var5;
  TPZElementMatrixT<double> *in_stack_ffffffffffff7910;
  int64_t in_stack_ffffffffffff7918;
  TPZMatRed<double,_TPZFMatrix<double>_> *in_stack_ffffffffffff7920;
  int64_t col;
  long *row;
  long local_86b8;
  long local_86b0;
  undefined1 local_86a0 [8];
  TPZFMatrix<double> *in_stack_ffffffffffff7968;
  TPZMatRed<double,_TPZFMatrix<double>_> *in_stack_ffffffffffff7970;
  undefined1 local_4360 [408];
  TPZVec<long> *in_stack_ffffffffffffbe38;
  TPZElementMatrixT<double> *in_stack_ffffffffffffbe40;
  TPZBaseMatrix local_4170 [523];
  TPZAutoPointer<TPZMatrix<double>_> local_10 [2];
  
  TPZMatRed<double,_TPZFMatrix<double>_>::K00(in_stack_ffffffffffff7908);
  pTVar2 = TPZAutoPointer<TPZMatrix<double>_>::operator->(local_10);
  (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xe])
            (pTVar2,(in_RDI->super_TPZElementMatrix).fConnect.super_TPZManVector<long,_10>.
                    super_TPZVec<long>.fNElements);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_ffffffffffff7910);
  row = (in_RDI->super_TPZElementMatrix).fConnect.super_TPZManVector<long,_10>.fExtAlloc;
  TPZMatRed<double,_TPZFMatrix<double>_>::Redim
            (in_stack_ffffffffffff7920,in_stack_ffffffffffff7918,(int64_t)in_stack_ffffffffffff7910)
  ;
  TPZMatRed<double,_TPZFMatrix<double>_>::Zero
            ((TPZMatRed<double,_TPZFMatrix<double>_> *)in_stack_ffffffffffff7910);
  TPZElementMatrixT<double>::TPZElementMatrixT(in_RDI);
  TPZElementMatrixT<double>::TPZElementMatrixT(in_RDI);
  plVar1 = (long *)(in_RDI->fMat).fBuf[0x1b];
  (**(code **)(*plVar1 + 0x108))(plVar1,local_4360,local_86a0);
  TPZElementMatrixT<double>::PermuteGather(in_stack_ffffffffffffbe40,in_stack_ffffffffffffbe38);
  TPZElementMatrixT<double>::PermuteGather(in_stack_ffffffffffffbe40,in_stack_ffffffffffffbe38);
  iVar3 = TPZBaseMatrix::Rows(local_4170);
  col = iVar3;
  for (local_86b0 = 0; local_86b0 < iVar3; local_86b0 = local_86b0 + 1) {
    for (local_86b8 = 0; local_86b8 < iVar3; local_86b8 = local_86b8 + 1) {
      pdVar4 = TPZFMatrix<double>::operator()((TPZFMatrix<double> *)in_RDI,(int64_t)row,col);
      pp_Var5 = (_func_int **)*pdVar4;
      in_stack_ffffffffffff7910 =
           (TPZElementMatrixT<double> *)
           TPZMatrix<double>::operator()((TPZMatrix<double> *)in_RDI,(int64_t)row,col);
      (((TPZBaseMatrix *)&(in_stack_ffffffffffff7910->super_TPZElementMatrix)._vptr_TPZElementMatrix
       )->super_TPZSavable)._vptr_TPZSavable = pp_Var5;
    }
  }
  TPZMatRed<double,_TPZFMatrix<double>_>::SetF(in_stack_ffffffffffff7970,in_stack_ffffffffffff7968);
  TPZMatRed<double,_TPZFMatrix<double>_>::SetReduced
            ((TPZMatRed<double,_TPZFMatrix<double>_> *)in_stack_ffffffffffff7910);
  TPZElementMatrixT<double>::~TPZElementMatrixT(in_stack_ffffffffffff7910);
  TPZElementMatrixT<double>::~TPZElementMatrixT(in_stack_ffffffffffff7910);
  return;
}

Assistant:

void TPZCondensedCompEl::Assemble()
{
    fCondensed.K00()->Redim(fNumInternalEqs, fNumInternalEqs);
    fCondensed.Redim(fNumTotalEqs, fNumInternalEqs);

    fCondensed.Zero();
    //TODOCOMPLEX
    TPZElementMatrixT<STATE> ek,ef;
    
    fReferenceCompEl->CalcStiff(ek,ef);
    ek.PermuteGather(fIndexes);
    ef.PermuteGather(fIndexes);

    int64_t dim = ek.fMat.Rows();
    for (int64_t i=0; i<dim ; ++i) {
        for (int64_t j=0; j<dim ; ++j) {
            fCondensed(i,j) = ek.fMat(i,j);
        }
    }
    
    fCondensed.SetF(ef.fMat);
    fCondensed.SetReduced();
}